

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::processLocalCommandInstruction(CoreBroker *this,ActionMessage *message)

{
  GlobalFederateId sourceId;
  GlobalFederateId destId;
  double t;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string_view V;
  string_view V_00;
  string_view string1;
  string_view newFederate;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  string_view V_01;
  string_view message_00;
  bool bVar1;
  int iVar2;
  TimeRepresentation<count_time<9,_long>_> TVar3;
  long lVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view sVar5;
  string_view timeString;
  string_view timeString_00;
  string_view name;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  string_view fmt;
  string_view str;
  format_args args;
  pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_128;
  size_type local_108;
  pointer pcStack_100;
  string warnString;
  ActionMessage warn;
  
  BrokerBase::processBaseCommands(&local_128,&this->super_BrokerBase,message);
  if (local_128.first != false) goto LAB_002d889c;
  __x._M_len = (local_128.second.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_len;
  __x._M_str = (local_128.second.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_str;
  __y._M_str = "monitor";
  __y._M_len = 7;
  bVar1 = std::operator==(__x,__y);
  if (!bVar1) {
    __x_00._M_len =
         (local_128.second.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_len;
    __x_00._M_str =
         (local_128.second.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_str;
    __y_02._M_str = "set";
    __y_02._M_len = 3;
    bVar1 = std::operator==(__x_00,__y_02);
    if (((bVar1) &&
        (0x20 < (ulong)((long)local_128.second.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_128.second.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start))) &&
       (__y_03._M_str = "barrier", __y_03._M_len = 7,
       bVar1 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                (local_128.second.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1),__y_03), bVar1)) {
      ActionMessage::ActionMessage(&warn,cmd_time_barrier);
      V._M_len = local_128.second.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2]._M_len;
      V._M_str = local_128.second.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2]._M_str;
      t = gmlc::utilities::numeric_conversionComplete<double>(V,0.0);
      warn.actionTime.internalTimeCode = count_time<9,_long>::convert(t);
      if (0x30 < (ulong)((long)local_128.second.
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_128.second.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        V_00._M_len = local_128.second.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[3]._M_len;
        V_00._M_str = local_128.second.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[3]._M_str;
        iVar2 = gmlc::utilities::numeric_conversionComplete<int>(V_00,0);
        warn.messageID = iVar2;
      }
      generateTimeBarrier(this,&warn);
    }
    else {
      __x_01._M_len =
           (local_128.second.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_len;
      __x_01._M_str =
           (local_128.second.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_str;
      __y_04._M_str = "clear";
      __y_04._M_len = 5;
      bVar1 = std::operator==(__x_01,__y_04);
      if (((!bVar1) ||
          ((ulong)((long)local_128.second.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_128.second.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) < 0x11)) ||
         (__y_05._M_str = "barrier", __y_05._M_len = 7,
         bVar1 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                  (local_128.second.
                                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1),__y_05), !bVar1))
      {
        warn._8_8_ = ((basic_string_view<char,_std::char_traits<char>_> *)
                     local_128.second.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_len;
        warn._0_8_ = ((basic_string_view<char,_std::char_traits<char>_> *)
                     local_128.second.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_str;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x26;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&warn;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&warnString,(v11 *)" unrecognized command instruction \"{}\"",fmt,args)
        ;
        local_108 = warnString._M_string_length;
        pcStack_100 = warnString._M_dataplus._M_p;
        message_00._M_str = warnString._M_dataplus._M_p;
        message_00._M_len = warnString._M_string_length;
        name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger
                  (&this->super_BrokerBase,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3,name,
                   message_00,false);
        sourceId.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        destId.gid = (message->source_id).gid;
        if (destId.gid != sourceId.gid) {
          ActionMessage::ActionMessage(&warn,cmd_warning,sourceId,destId);
          SmallBuffer::operator=(&warn.payload,&warnString);
          warn.messageID = 3;
          str._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
          str._M_len = (this->super_BrokerBase).identifier._M_string_length;
          ActionMessage::setString(&warn,0,str);
          routeMessage(this,&warn);
          ActionMessage::~ActionMessage(&warn);
        }
        std::__cxx11::string::~string((string *)&warnString);
        goto LAB_002d889c;
      }
      ActionMessage::ActionMessage(&warn,cmd_time_barrier_clear);
      warn.flags._1_1_ = warn.flags._1_1_ | 0x20;
      if (0x20 < (ulong)((long)local_128.second.
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_128.second.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        V_01._M_len = local_128.second.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2]._M_len;
        V_01._M_str = local_128.second.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2]._M_str;
        iVar2 = gmlc::utilities::numeric_conversionComplete<int>(V_01,0);
        warn.messageID = iVar2;
      }
      generateTimeBarrier(this,&warn);
    }
    ActionMessage::~ActionMessage(&warn);
    goto LAB_002d889c;
  }
  lVar4 = (long)local_128.second.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_128.second.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (lVar4 == 1) goto LAB_002d889c;
  if (lVar4 == 3) {
    timeString._M_str = (char *)0x5;
    timeString._M_len =
         (size_t)((basic_string_view<char,_std::char_traits<char>_> *)
                 (local_128.second.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 2))->_M_str;
    TVar3 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                      ((utilities *)
                       ((basic_string_view<char,_std::char_traits<char>_> *)
                       (local_128.second.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 2))->_M_len,timeString,ms);
LAB_002d8705:
    (this->mTimeMonitorPeriod).internalTimeCode = TVar3.internalTimeCode;
  }
  else {
    if (lVar4 != 2) {
      string1._M_len =
           local_128.second.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2]._M_len;
      string1._M_str =
           local_128.second.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2]._M_str;
      sVar5._M_len = local_128.second.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[3]._M_len;
      sVar5._M_str = local_128.second.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[3]._M_str;
      sVar5 = gmlc::utilities::string_viewOps::merge(string1,sVar5);
      timeString_00._M_str = (char *)0x5;
      timeString_00._M_len = (size_t)sVar5._M_str;
      TVar3 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                        ((utilities *)sVar5._M_len,timeString_00,sec);
      goto LAB_002d8705;
    }
    __y_00._M_str = "stop";
    __y_00._M_len = 4;
    bVar1 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                             (local_128.second.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1),__y_00);
    if ((bVar1) ||
       (__y_01._M_str = "off", __y_01._M_len = 3,
       bVar1 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                (local_128.second.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1),__y_01), bVar1)) {
      loadTimeMonitor(this,false,(string_view)(ZEXT816(0x38cfc2) << 0x40));
      goto LAB_002d889c;
    }
  }
  newFederate._M_len =
       local_128.second.
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1]._M_len;
  newFederate._M_str =
       local_128.second.
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1]._M_str;
  loadTimeMonitor(this,false,newFederate);
LAB_002d889c:
  CLI::std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_128.second.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  return;
}

Assistant:

void CoreBroker::processLocalCommandInstruction(ActionMessage& message)
{
    auto [processed, res] = processBaseCommands(message);
    if (processed) {
        return;
    }

    if (res[0] == "monitor") {
        switch (res.size()) {
            case 1:
                break;
            case 2:
                if (res[1] == "stop" || res[1] == "off") {
                    loadTimeMonitor(false, "");
                } else {
                    loadTimeMonitor(false, res[1]);
                }
                break;
            case 3:
                mTimeMonitorPeriod = loadTimeFromString(res[2], time_units::sec);
                loadTimeMonitor(false, res[1]);
                break;
            case 4:
            default:
                mTimeMonitorPeriod =
                    loadTimeFromString(gmlc::utilities::string_viewOps::merge(res[2], res[3]),
                                       time_units::sec);
                loadTimeMonitor(false, res[1]);
                break;
        }
    } else if ((res[0] == "set") && (res.size() > 2 && res[1] == "barrier")) {
        ActionMessage barrier(CMD_TIME_BARRIER);
        barrier.actionTime = gmlc::utilities::numeric_conversionComplete<double>(res[2], 0.0);
        if (res.size() >= 4) {
            barrier.messageID =
                gmlc::utilities::numeric_conversionComplete<std::int32_t>(res[3], 0);
        }

        generateTimeBarrier(barrier);
    } else if ((res[0] == "clear") && (res.size() >= 2 && res[1] == "barrier")) {
        ActionMessage barrier(CMD_TIME_BARRIER_CLEAR);
        setActionFlag(barrier, cancel_flag);
        if (res.size() >= 3) {
            barrier.messageID =
                gmlc::utilities::numeric_conversionComplete<std::int32_t>(res[2], 0);
        }
        generateTimeBarrier(barrier);
    } else {
        auto warnString = fmt::format(" unrecognized command instruction \"{}\"", res[0]);
        LOG_WARNING(global_broker_id_local, getIdentifier(), warnString);
        if (message.source_id != global_broker_id_local) {
            ActionMessage warn(CMD_WARNING, global_broker_id_local, message.source_id);
            warn.payload = std::move(warnString);
            warn.messageID = HELICS_LOG_LEVEL_WARNING;
            warn.setString(0, getIdentifier());
            routeMessage(warn);
        }
    }
}